

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall capnp::DynamicValue::Builder::Builder(Builder *this,Builder *other)

{
  Client *params;
  Builder *other_local;
  Builder *this_local;
  
  if ((other->type < CAPABILITY) || (other->type != CAPABILITY)) {
    memcpy(this,other,0x40);
  }
  else {
    this->type = CAPABILITY;
    params = kj::mv<capnp::DynamicCapability::Client>(&(other->field_1).capabilityValue);
    kj::ctor<capnp::DynamicCapability::Client,capnp::DynamicCapability::Client>
              (&(this->field_1).capabilityValue,params);
  }
  return;
}

Assistant:

DynamicValue::Builder::Builder(Builder&& other) noexcept {
  switch (other.type) {
    case UNKNOWN:
    case VOID:
    case BOOL:
    case INT:
    case UINT:
    case FLOAT:
    case TEXT:
    case DATA:
    case LIST:
    case ENUM:
    case STRUCT:
    case ANY_POINTER:
      // Unfortunately __has_trivial_copy doesn't work on these types due to the use of
      // DisallowConstCopy, but __has_trivial_destructor should detect if any of these types
      // become non-trivial.
      static_assert(KJ_HAS_TRIVIAL_DESTRUCTOR(Text::Builder) &&
                    KJ_HAS_TRIVIAL_DESTRUCTOR(Data::Builder) &&
                    KJ_HAS_TRIVIAL_DESTRUCTOR(DynamicList::Builder) &&
                    KJ_HAS_TRIVIAL_DESTRUCTOR(DynamicEnum) &&
                    KJ_HAS_TRIVIAL_DESTRUCTOR(DynamicStruct::Builder) &&
                    KJ_HAS_TRIVIAL_DESTRUCTOR(AnyPointer::Builder),
                    "Assumptions here don't hold.");
      break;

    case CAPABILITY:
      type = CAPABILITY;
      kj::ctor(capabilityValue, kj::mv(other.capabilityValue));
      return;
  }

  memcpy(this, &other, sizeof(*this));
}